

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O0

void EXPLORE_EVAL::output_example_seq(vw *all,explore_eval *data,multi_ex *ec_seq)

{
  undefined4 uVar1;
  code *pcVar2;
  size_type sVar3;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  long in_RDI;
  multi_ex *in_stack_00000268;
  example *in_stack_00000270;
  explore_eval *in_stack_00000278;
  vw *in_stack_00000280;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  allocator local_41;
  string local_40 [32];
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_20;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  long local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  sVar3 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RDX);
  if (sVar3 != 0) {
    local_20._M_current =
         (example **)
         std::vector<example_*,_std::allocator<example_*>_>::begin
                   ((vector<example_*,_std::allocator<example_*>_> *)
                    CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator*(&local_20);
    output_example(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268);
    if (0 < *(int *)(local_8 + 0x3530)) {
      pcVar2 = *(code **)(local_8 + 0x3540);
      uVar1 = *(undefined4 *)(local_8 + 0x3530);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"",&local_41);
      std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
      (*pcVar2)(uVar1,local_40);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
  }
  return;
}

Assistant:

void output_example_seq(vw& all, explore_eval& data, multi_ex& ec_seq)
{
  if (ec_seq.size() > 0)
  {
    output_example(all, data, **(ec_seq.begin()), &(ec_seq));
    if (all.raw_prediction > 0)
      all.print_text(all.raw_prediction, "", ec_seq[0]->tag);
  }
}